

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O2

void __thiscall
rsg::BinaryVecOp<4,_true,_true,_false,_rsg::ComputeMulRange,_rsg::EvaluateMul>::evaluate
          (BinaryVecOp<4,_true,_true,_false,_rsg::ComputeMulRange,_rsg::EvaluateMul> *this,
          ExecValueAccess dst,ExecConstValueAccess a,ExecConstValueAccess b)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int compNdx;
  long lVar5;
  int elemNdx;
  int iVar6;
  ConstStridedValueAccess<64> CVar7;
  StridedValueAccess<64> SVar8;
  StridedValueAccess<64> local_50;
  ConstStridedValueAccess<64> local_40;
  
  local_50.super_ConstStridedValueAccess<64>.m_value = dst.super_ConstStridedValueAccess<64>.m_value
  ;
  local_50.super_ConstStridedValueAccess<64>.m_type = dst.super_ConstStridedValueAccess<64>.m_type;
  local_40.m_value = a.m_value;
  local_40.m_type = a.m_type;
  if ((local_50.super_ConstStridedValueAccess<64>.m_type)->m_baseType == TYPE_FLOAT) {
    for (iVar6 = 0; iVar6 < (local_50.super_ConstStridedValueAccess<64>.m_type)->m_numElements;
        iVar6 = iVar6 + 1) {
      for (lVar5 = 0; lVar5 != 0x40; lVar5 = lVar5 + 1) {
        CVar7 = ConstStridedValueAccess<64>::component(&local_40,iVar6);
        fVar1 = CVar7.m_value[lVar5].floatVal;
        CVar7 = ConstStridedValueAccess<64>::component(&b,iVar6);
        fVar2 = CVar7.m_value[lVar5].floatVal;
        SVar8 = StridedValueAccess<64>::component(&local_50,iVar6);
        SVar8.super_ConstStridedValueAccess<64>.m_value[lVar5].floatVal = fVar1 * fVar2;
      }
    }
  }
  else if ((local_50.super_ConstStridedValueAccess<64>.m_type)->m_baseType == TYPE_INT) {
    for (iVar6 = 0; iVar6 < (local_50.super_ConstStridedValueAccess<64>.m_type)->m_numElements;
        iVar6 = iVar6 + 1) {
      for (lVar5 = 0; lVar5 != 0x40; lVar5 = lVar5 + 1) {
        CVar7 = ConstStridedValueAccess<64>::component(&local_40,iVar6);
        iVar3 = CVar7.m_value[lVar5].intVal;
        CVar7 = ConstStridedValueAccess<64>::component(&b,iVar6);
        iVar4 = CVar7.m_value[lVar5].intVal;
        SVar8 = StridedValueAccess<64>::component(&local_50,iVar6);
        SVar8.super_ConstStridedValueAccess<64>.m_value[lVar5].intVal = iVar3 * iVar4;
      }
    }
  }
  return;
}

Assistant:

void BinaryVecOp<Precedence, Float, Int, Bool, ComputeValueRange, EvaluateComp>::evaluate (ExecValueAccess dst, ExecConstValueAccess a, ExecConstValueAccess b)
{
	DE_ASSERT(dst.getType() == a.getType());
	DE_ASSERT(dst.getType() == b.getType());
	switch (dst.getType().getBaseType())
	{
		case VariableType::TYPE_FLOAT:
			for (int elemNdx = 0; elemNdx < dst.getType().getNumElements(); elemNdx++)
			{
				for (int compNdx = 0; compNdx < EXEC_VEC_WIDTH; compNdx++)
					dst.component(elemNdx).asFloat(compNdx) = EvaluateComp()(a.component(elemNdx).asFloat(compNdx), b.component(elemNdx).asFloat(compNdx));
			}
			break;

		case VariableType::TYPE_INT:
			for (int elemNdx = 0; elemNdx < dst.getType().getNumElements(); elemNdx++)
			{
				for (int compNdx = 0; compNdx < EXEC_VEC_WIDTH; compNdx++)
					dst.component(elemNdx).asInt(compNdx) = EvaluateComp()(a.component(elemNdx).asInt(compNdx), b.component(elemNdx).asInt(compNdx));
			}
			break;

		default:
			DE_ASSERT(DE_FALSE); // Invalid type for multiplication
	}
}